

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_constructor_declarations
               (writer *w,TypeDef *type,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
               *factories)

{
  uint32_t *puVar1;
  char *this;
  bool bVar2;
  MethodDef *pMVar3;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *pvVar4;
  size_type sVar5;
  anon_class_8_1_89897ddb_conflict1 local_388;
  char *local_380;
  basic_string_view<char,_std::char_traits<char>_> local_378;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *local_368;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *params;
  method_signature signature_1;
  value_type *method_1;
  MethodDef __end4_1;
  MethodDef __begin4_1;
  pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *__range4_1;
  char *local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  undefined1 local_1d0 [8];
  method_signature signature;
  value_type *method;
  MethodDef __end4;
  MethodDef __begin4;
  pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *__range4;
  type *local_60;
  type *factory;
  type *factory_name;
  _Self local_48;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
  *__range1;
  string_view type_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
  *factories_local;
  TypeDef *type_local;
  writer *w_local;
  
  type_name._M_str = (char *)factories;
  ___range1 = winmd::reader::TypeDef::TypeName(type);
  this = type_name._M_str;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                    *)type_name._M_str);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
              *)this);
  while (bVar2 = std::operator!=(&__end1,&local_48), bVar2) {
    factory_name = &std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>
                    ::operator*(&__end1)->first;
    factory = (type *)::std::get<0ul,std::__cxx11::string_const,cppwinrt::factory_info>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>
                                  *)factory_name);
    local_60 = ::std::get<1ul,std::__cxx11::string_const,cppwinrt::factory_info>
                         ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>
                           *)factory_name);
    if ((local_60->activatable & 1U) == 0) {
      if (((local_60->composable & 1U) != 0) && ((local_60->visible & 1U) != 0)) {
        winmd::reader::TypeDef::MethodList
                  ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)
                   &__begin4_1.super_row_base<winmd::reader::MethodDef>.m_index,&local_60->type);
        puVar1 = &__begin4_1.super_row_base<winmd::reader::MethodDef>.m_index;
        pMVar3 = winmd::reader::begin<winmd::reader::MethodDef>
                           ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)puVar1);
        __end4_1.super_row_base<winmd::reader::MethodDef>._8_8_ =
             (pMVar3->super_row_base<winmd::reader::MethodDef>).m_table;
        __begin4_1.super_row_base<winmd::reader::MethodDef>.m_table =
             *(table_base **)&(pMVar3->super_row_base<winmd::reader::MethodDef>).m_index;
        pMVar3 = winmd::reader::end<winmd::reader::MethodDef>
                           ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)puVar1);
        method_1 = (value_type *)(pMVar3->super_row_base<winmd::reader::MethodDef>).m_table;
        __end4_1.super_row_base<winmd::reader::MethodDef>.m_table =
             *(table_base **)&(pMVar3->super_row_base<winmd::reader::MethodDef>).m_index;
        while (bVar2 = winmd::reader::row_base<winmd::reader::MethodDef>::operator!=
                                 ((row_base<winmd::reader::MethodDef> *)
                                  &__end4_1.super_row_base<winmd::reader::MethodDef>.m_index,
                                  (row_base<winmd::reader::MethodDef> *)&method_1), bVar2) {
          signature_1.m_return.super_row_base<winmd::reader::Param>._8_8_ =
               winmd::reader::row_base<winmd::reader::MethodDef>::operator*
                         ((row_base<winmd::reader::MethodDef> *)
                          &__end4_1.super_row_base<winmd::reader::MethodDef>.m_index);
          method_signature::method_signature
                    ((method_signature *)&params,
                     (MethodDef *)signature_1.m_return.super_row_base<winmd::reader::Param>._8_8_);
          pvVar4 = method_signature::params((method_signature *)&params);
          local_368 = pvVar4;
          sVar5 = std::
                  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                  ::size(pvVar4);
          std::
          vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
          ::resize(pvVar4,sVar5 - 2);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_378,"        %%(%);\n");
          pvVar4 = method_signature::params((method_signature *)&params);
          sVar5 = std::
                  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                  ::size(pvVar4);
          local_380 = "";
          if (sVar5 == 1) {
            local_380 = "explicit ";
          }
          local_388 = bind<&cppwinrt::write_consume_params,_cppwinrt::method_signature_&>
                                ((method_signature *)&params);
          writer_base<cppwinrt::writer>::
          write<const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                    (&w->super_writer_base<cppwinrt::writer>,&local_378,&local_380,
                     (basic_string_view<char,_std::char_traits<char>_> *)&__range1,&local_388);
          method_signature::~method_signature((method_signature *)&params);
          winmd::reader::row_base<winmd::reader::MethodDef>::operator++
                    ((row_base<winmd::reader::MethodDef> *)
                     &__end4_1.super_row_base<winmd::reader::MethodDef>.m_index);
        }
      }
    }
    else {
      bVar2 = winmd::reader::row_base::operator_cast_to_bool((row_base *)local_60);
      if (bVar2) {
        winmd::reader::TypeDef::MethodList
                  ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)
                   &__begin4.super_row_base<winmd::reader::MethodDef>.m_index,&local_60->type);
        puVar1 = &__begin4.super_row_base<winmd::reader::MethodDef>.m_index;
        pMVar3 = winmd::reader::begin<winmd::reader::MethodDef>
                           ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)puVar1);
        __end4.super_row_base<winmd::reader::MethodDef>._8_8_ =
             (pMVar3->super_row_base<winmd::reader::MethodDef>).m_table;
        __begin4.super_row_base<winmd::reader::MethodDef>.m_table =
             *(table_base **)&(pMVar3->super_row_base<winmd::reader::MethodDef>).m_index;
        pMVar3 = winmd::reader::end<winmd::reader::MethodDef>
                           ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)puVar1);
        method = (value_type *)(pMVar3->super_row_base<winmd::reader::MethodDef>).m_table;
        __end4.super_row_base<winmd::reader::MethodDef>.m_table =
             *(table_base **)&(pMVar3->super_row_base<winmd::reader::MethodDef>).m_index;
        while (bVar2 = winmd::reader::row_base<winmd::reader::MethodDef>::operator!=
                                 ((row_base<winmd::reader::MethodDef> *)
                                  &__end4.super_row_base<winmd::reader::MethodDef>.m_index,
                                  (row_base<winmd::reader::MethodDef> *)&method), bVar2) {
          signature.m_return.super_row_base<winmd::reader::Param>._8_8_ =
               winmd::reader::row_base<winmd::reader::MethodDef>::operator*
                         ((row_base<winmd::reader::MethodDef> *)
                          &__end4.super_row_base<winmd::reader::MethodDef>.m_index);
          method_signature::method_signature
                    ((method_signature *)local_1d0,
                     (MethodDef *)signature.m_return.super_row_base<winmd::reader::Param>._8_8_);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_1e0,"        %%(%);\n");
          pvVar4 = method_signature::params((method_signature *)local_1d0);
          sVar5 = std::
                  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                  ::size(pvVar4);
          local_1e8 = "";
          if (sVar5 == 1) {
            local_1e8 = "explicit ";
          }
          __range4_1 = (pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)
                       bind<&cppwinrt::write_consume_params,_cppwinrt::method_signature_&>
                                 ((method_signature *)local_1d0);
          writer_base<cppwinrt::writer>::
          write<const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                    (&w->super_writer_base<cppwinrt::writer>,&local_1e0,&local_1e8,
                     (basic_string_view<char,_std::char_traits<char>_> *)&__range1,
                     (anon_class_8_1_89897ddb_conflict1 *)&__range4_1);
          method_signature::~method_signature((method_signature *)local_1d0);
          winmd::reader::row_base<winmd::reader::MethodDef>::operator++
                    ((row_base<winmd::reader::MethodDef> *)
                     &__end4.super_row_base<winmd::reader::MethodDef>.m_index);
        }
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&__range4,"        %();\n");
        writer_base<cppwinrt::writer>::write<std::basic_string_view<char,std::char_traits<char>>>
                  (&w->super_writer_base<cppwinrt::writer>,(string_view *)&__range4,
                   (basic_string_view<char,_std::char_traits<char>_> *)&__range1);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void write_constructor_declarations(writer& w, TypeDef const& type, std::map<std::string, factory_info> const& factories)
    {
        auto type_name = type.TypeName();

        for (auto&& [factory_name, factory] : factories)
        {
            if (factory.activatable)
            {
                if (!factory.type)
                {
                    w.write("        %();\n", type_name);
                }
                else
                {
                    for (auto&& method : factory.type.MethodList())
                    {
                        method_signature signature{ method };

                        w.write("        %%(%);\n",
                            signature.params().size() == 1 ? "explicit " : "",
                            type_name,
                            bind<write_consume_params>(signature));
                    }
                }
            }
            else if (factory.composable && factory.visible)
            {
                for (auto&& method : factory.type.MethodList())
                {
                    method_signature signature{ method };
                    auto& params = signature.params();
                    params.resize(params.size() - 2);

                    w.write("        %%(%);\n",
                        signature.params().size() == 1 ? "explicit " : "",
                        type_name,
                        bind<write_consume_params>(signature));
                }
            }
        }
    }